

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetHomeDirectory(cmake *this,string *dir)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  string *local_18;
  string *dir_local;
  cmake *this_local;
  
  local_18 = dir;
  dir_local = (string *)this;
  cmState::SetSourceDirectory(this->State,dir);
  bVar1 = cmState::Snapshot::IsValid(&this->CurrentSnapshot);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"CMAKE_SOURCE_DIR",&local_39);
    cmState::Snapshot::SetDefinition(&this->CurrentSnapshot,&local_38,local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void cmake::SetHomeDirectory(const std::string& dir)
{
  this->State->SetSourceDirectory(dir);
  if (this->CurrentSnapshot.IsValid())
    {
    this->CurrentSnapshot.SetDefinition("CMAKE_SOURCE_DIR", dir);
    }
}